

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O1

void __thiscall
duckdb::ColumnReader::
PlainSkipTemplatedDefines<duckdb::DecimalParquetValueConversion<long,true>,false>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values)

{
  ulong req_len;
  
  if (num_values != 0) {
    do {
      req_len = (ulong)this->column_schema->type_length;
      ByteBuffer::available(plain_data,req_len);
      plain_data->len = plain_data->len - req_len;
      plain_data->ptr = plain_data->ptr + req_len;
      num_values = num_values - 1;
    } while (num_values != 0);
  }
  return;
}

Assistant:

void PlainSkipTemplatedInternal(ByteBuffer &plain_data, const uint8_t *__restrict defines,
	                                const uint64_t num_values, idx_t row_offset = 0) {
		if (!HAS_DEFINES && CONVERSION::PlainConstantSize() > 0) {
			if (CHECKED) {
				plain_data.inc(num_values * CONVERSION::PlainConstantSize());
			} else {
				plain_data.unsafe_inc(num_values * CONVERSION::PlainConstantSize());
			}
			return;
		}
		for (idx_t row_idx = row_offset; row_idx < row_offset + num_values; row_idx++) {
			if (HAS_DEFINES && defines[row_idx] != MaxDefine()) {
				continue;
			}
			CONVERSION::template PlainSkip<CHECKED>(plain_data, *this);
		}
	}